

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_error.hpp
# Opt level: O2

void __thiscall boost::system::system_error::~system_error(system_error *this)

{
  *(undefined ***)this = &PTR__system_error_00128c30;
  std::__cxx11::string::~string((string *)&this->m_what);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

virtual ~system_error() BOOST_NOEXCEPT_OR_NOTHROW {}